

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LRNLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lrn(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LRNLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_lrn(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lrn(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LRNLayerParams>(arena);
    (this->layer_).lrn_ = pLVar2;
  }
  return (LRNLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LRNLayerParams* NeuralNetworkLayer::_internal_mutable_lrn() {
  if (!_internal_has_lrn()) {
    clear_layer();
    set_has_lrn();
    layer_.lrn_ = CreateMaybeMessage< ::CoreML::Specification::LRNLayerParams >(GetArenaForAllocation());
  }
  return layer_.lrn_;
}